

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

ZoneState *
QLocalTime::mapLocalTime(ZoneState *__return_storage_ptr__,qint64 local,TransitionOptions resolve)

{
  long lVar1;
  DaylightStatus DVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  qint64 qVar7;
  long in_FS_OFFSET;
  MkTimeResult use;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  use._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  use.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
  use.utcSecs = (time_t)&DAT_aaaaaaaaaaaaaaaa;
  use.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  use.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
  use.local._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  use.local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  use.local._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  use.local._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_2db0c8::resolveLocalTime(&use,local / 1000,resolve);
  DVar2 = UnknownDaylightTime;
  lVar3 = 0;
  if (use.good == true) {
    lVar5 = (int)use.local.tm_gmtoff + use.utcSecs;
    lVar6 = lVar5 * 1000;
    qVar7 = lVar6 + local % 1000;
    lVar3 = use.local.tm_gmtoff;
    if (!SCARRY8(lVar6,local % 1000) && SEXT816(lVar6) == SEXT816(lVar5) * SEXT416(1000)) {
      DVar2 = (DaylightStatus)(0 < use.local.tm_isdst);
      bVar4 = true;
      goto LAB_0012164d;
    }
  }
  bVar4 = false;
  qVar7 = local;
LAB_0012164d:
  __return_storage_ptr__->when = qVar7;
  __return_storage_ptr__->offset = (int)lVar3;
  __return_storage_ptr__->dst = DVar2;
  __return_storage_ptr__->valid = bVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState mapLocalTime(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    // Revised later to match what use.local tells us:
    qint64 localSecs = local / MSECS_PER_SEC;
    auto use = resolveLocalTime(localSecs, resolve);
    if (!use.good)
        return {local};

    qint64 millis = local - localSecs * MSECS_PER_SEC;
    // Division is defined to round towards zero:
    Q_ASSERT(local < 0 ? (millis <= 0 && millis > -MSECS_PER_SEC)
                       : (millis >= 0 && millis < MSECS_PER_SEC));

    QDateTimePrivate::DaylightStatus dst =
        use.local.tm_isdst > 0 ? QDateTimePrivate::DaylightTime : QDateTimePrivate::StandardTime;

#ifdef HAVE_TM_GMTOFF
    const int offset = use.local.tm_gmtoff;
    localSecs = offset + use.utcSecs;
#else
    // Provisional offset, until we have a revised localSecs:
    int offset = localSecs - use.utcSecs;
    auto jd = tmToJd(use.local);
    if (Q_UNLIKELY(!jd))
        return {local, offset, dst, false};

    qint64 daySecs = tmSecsWithinDay(use.local);
    Q_ASSERT(0 <= daySecs && daySecs < SECS_PER_DAY);
    if (daySecs > 0 && *jd < JULIAN_DAY_FOR_EPOCH) {
        jd = *jd + 1;
        daySecs -= SECS_PER_DAY;
    }
    if (Q_UNLIKELY(daysAndSecondsOverflow(*jd, daySecs, &localSecs)))
        return {local, offset, dst, false};

    // Use revised localSecs to refine offset:
    offset = localSecs - use.utcSecs;
#endif // HAVE_TM_GMTOFF

    // The only way localSecs and millis can now have opposite sign is for
    // resolution of the local time to have kicked us across the epoch, in which
    // case there's no danger of overflow. So if overflow is in danger of
    // happening, we're already doing the best we can to avoid it.
    qint64 revised;
    if (secondsAndMillisOverflow(localSecs, millis, &revised))
        return {local, offset, QDateTimePrivate::UnknownDaylightTime, false};
    return {revised, offset, dst, true};
}